

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

int mbhitm(monst *mtmp,obj *otmp)

{
  short sVar1;
  bool bVar2;
  byte bVar3;
  boolean bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  obj *poVar8;
  int local_1c;
  boolean reveal_invis;
  int tmp;
  obj *otmp_local;
  monst *mtmp_local;
  
  bVar2 = false;
  if ((mtmp != &youmonst) &&
     (*(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ffff, mtmp->m_ap_type != '\0')
     ) {
    seemimic(mtmp);
  }
  sVar1 = otmp->otyp;
  if (sVar1 == 0x1a1) {
LAB_00264b23:
    cancel_monst(mtmp,otmp,'\0','\x01','\0');
  }
  else if (sVar1 == 0x1c4) {
    bVar2 = true;
    if (mtmp == &youmonst) {
      if (zap_oseen != '\0') {
        discover_object(0x1c4,'\x01','\x01');
      }
      if ((u.uprops[0x2c].extrinsic == 0) &&
         ((u.umonnum == u.umonster || (bVar4 = resists_magm(&youmonst), bVar4 == '\0')))) {
        iVar6 = rnd(0x14);
        if (iVar6 < u.uac + 10) {
          pline("The wand hits you!");
          local_1c = dice(2,0xc);
          if ((u.uprops[0x32].intrinsic != 0) || (u.uprops[0x32].extrinsic != 0)) {
            local_1c = (local_1c + 1) / 2;
          }
          losehp(local_1c,"wand",0);
        }
        else {
          pline("The wand misses you.");
        }
      }
      else {
        shieldeff(u.ux,u.uy);
        pline("Boing!");
      }
      stop_occupation();
      nomul(0,(char *)0x0);
    }
    else {
      bVar4 = resists_magm(mtmp);
      if (bVar4 == '\0') {
        iVar6 = rnd(0x14);
        iVar5 = find_mac(mtmp);
        if (iVar6 < iVar5 + 10) {
          iVar6 = dice(2,0xc);
          pcVar7 = exclam(iVar6);
          hit("wand",'\0',mtmp,pcVar7);
          resist(mtmp,otmp->oclass,iVar6,1);
          if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) && (zap_oseen != '\0')) {
            discover_object(0x1c4,'\x01','\x01');
          }
        }
        else {
          miss("wand",mtmp);
          if (((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) && (zap_oseen != '\0')) {
            discover_object(0x1c4,'\x01','\x01');
          }
        }
      }
      else {
        shieldeff(mtmp->mx,mtmp->my);
        pline("Boing!");
      }
    }
  }
  else {
    if (sVar1 == 0x1ca) goto LAB_00264b23;
    if (sVar1 == 0x1cb) {
      if (mtmp == &youmonst) {
        if (zap_oseen != '\0') {
          discover_object(0x1cb,'\x01','\x01');
        }
        tele((char *)0x0);
      }
      else if (((*(uint *)&mtmp->field_0x60 >> 0x1c & 1) == 0) ||
              (pcVar7 = in_rooms(level,mtmp->mx,mtmp->my,10), *pcVar7 == '\0')) {
        bVar4 = tele_restrict(mtmp);
        if (bVar4 == '\0') {
          rloc(level,mtmp,'\0');
        }
      }
      else {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) {
          pcVar7 = Monnam(mtmp);
          pline("%s resists the magic!",pcVar7);
        }
        *(uint *)&mtmp->field_0x60 = *(uint *)&mtmp->field_0x60 & 0xfff7ffff;
        if (mtmp->m_ap_type != '\0') {
          seemimic(mtmp);
        }
      }
    }
  }
  if (!bVar2) {
    return 0;
  }
  if (mtmp->mhp < 1) {
    return 0;
  }
  if ((viz_array[bhitpos.y][bhitpos.x] & 2U) == 0) {
    return 0;
  }
  if (mtmp->wormno == '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         (((u.uprops[0x40].intrinsic == 0 &&
           ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
          ((mtmp->data->mflags3 & 0x200) == 0)))) goto LAB_00264d71;
      bVar3 = viz_array[mtmp->my][mtmp->mx] & 1;
      goto joined_r0x00264cde;
    }
  }
  else {
    bVar3 = worm_known(level,mtmp);
joined_r0x00264cde:
    if (bVar3 == 0) goto LAB_00264d71;
  }
  if (((((((*(uint *)&mtmp->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
        (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
      (((*(uint *)&mtmp->field_0x60 >> 7 & 1) == 0 && ((*(uint *)&mtmp->field_0x60 >> 9 & 1) == 0)))
      ) && (((byte)u._1052_1_ >> 5 & 1) == 0)) {
    return 0;
  }
LAB_00264d71:
  if (((((mtmp->data->mflags1 & 0x10000) != 0) ||
       ((poVar8 = which_armor(mtmp,4), poVar8 != (obj *)0x0 &&
        (poVar8 = which_armor(mtmp,4), poVar8->otyp == 0x4f)))) ||
      (((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          ((((u.uprops[0x19].intrinsic == 0 &&
             ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
            (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)))))) ||
        (u.uprops[0x19].blocked != 0)) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar6 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar6)))))) &&
     (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
      (bVar4 = match_warn_of_mon(mtmp), bVar4 == '\0')))) {
    map_invisible(bhitpos.x,bhitpos.y);
  }
  return 0;
}

Assistant:

static int mbhitm(struct monst *mtmp, struct obj *otmp)
{
	int tmp;

	boolean reveal_invis = FALSE;
	if (mtmp != &youmonst) {
		mtmp->msleeping = 0;
		if (mtmp->m_ap_type) seemimic(mtmp);
	}
	switch(otmp->otyp) {
	case WAN_STRIKING:
		reveal_invis = TRUE;
		if (mtmp == &youmonst) {
			if (zap_oseen) makeknown(WAN_STRIKING);
			if (Antimagic) {
			    shieldeff(u.ux, u.uy);
			    pline("Boing!");
			} else if (rnd(20) < 10 + u.uac) {
			    pline("The wand hits you!");
			    tmp = dice(2,12);
			    if (Half_spell_damage) tmp = (tmp+1) / 2;
			    losehp(tmp, "wand", KILLED_BY_AN);
			} else pline("The wand misses you.");
			stop_occupation();
			nomul(0, NULL);
		} else if (resists_magm(mtmp)) {
			shieldeff(mtmp->mx, mtmp->my);
			pline("Boing!");
		} else if (rnd(20) < 10+find_mac(mtmp)) {
			tmp = dice(2,12);
			hit("wand", FALSE, mtmp, exclam(tmp));
			resist(mtmp, otmp->oclass, tmp, TELL);
			if (cansee(mtmp->mx, mtmp->my) && zap_oseen)
				makeknown(WAN_STRIKING);
		} else {
			miss("wand", mtmp);
			if (cansee(mtmp->mx, mtmp->my) && zap_oseen)
				makeknown(WAN_STRIKING);
		}
		break;
	case WAN_TELEPORTATION:
		if (mtmp == &youmonst) {
			if (zap_oseen) makeknown(WAN_TELEPORTATION);
			tele(NULL);
		} else {
			/* for consistency with zap.c, don't identify */
			if (mtmp->ispriest &&
				*in_rooms(level, mtmp->mx, mtmp->my, TEMPLE)) {
			    if (cansee(mtmp->mx, mtmp->my))
				pline("%s resists the magic!", Monnam(mtmp));
			    mtmp->msleeping = 0;
			    if (mtmp->m_ap_type) seemimic(mtmp);
			} else if (!tele_restrict(mtmp))
			    rloc(level, mtmp, FALSE);
		}
		break;
	case WAN_CANCELLATION:
	case SPE_CANCELLATION:
		cancel_monst(mtmp, otmp, FALSE, TRUE, FALSE);
		break;
	}
	if (reveal_invis) {
	    if (mtmp->mhp > 0 && cansee(bhitpos.x,bhitpos.y)
							&& !canspotmon(level, mtmp))
		map_invisible(bhitpos.x, bhitpos.y);
	}
	return 0;
}